

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

TypeTable * BookReaderTypeTable(void)

{
  return &BookReaderTypeTable::tt;
}

Assistant:

inline const ::flatbuffers::TypeTable *BookReaderTypeTable() {
  static const ::flatbuffers::TypeCode type_codes[] = {
    { ::flatbuffers::ET_INT, 0, -1 }
  };
  static const int64_t values[] = { 0, 4 };
  static const char * const names[] = {
    "books_read"
  };
  static const ::flatbuffers::TypeTable tt = {
    ::flatbuffers::ST_STRUCT, 1, type_codes, nullptr, nullptr, values, names
  };
  return &tt;
}